

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O2

qpTestResult __thiscall
gl4cts::ClipControlDepthModeOneToOneTest::ValidateFramebuffer
          (ClipControlDepthModeOneToOneTest *this,Context *context)

{
  TestLog *log;
  RenderContext *pRVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  int x;
  int y;
  int iVar5;
  qpTestResult qVar6;
  float fVar7;
  Surface renderedColorFrame;
  Surface referenceColorFrame;
  TextureFormat depthFormat;
  PixelBufferAccess local_a8;
  TextureLevel referenceDepthFrame;
  TextureLevel renderedDepthFrame;
  
  iVar4 = (*context->m_renderCtx->_vptr_RenderContext[4])();
  iVar5 = *(int *)CONCAT44(extraout_var,iVar4);
  iVar4 = ((int *)CONCAT44(extraout_var,iVar4))[1];
  tcu::Surface::Surface(&renderedColorFrame,iVar5,iVar4);
  tcu::Surface::Surface(&referenceColorFrame,iVar5,iVar4);
  depthFormat.order = D;
  depthFormat.type = FLOAT;
  tcu::TextureLevel::TextureLevel(&renderedDepthFrame,&depthFormat,iVar5,iVar4,1);
  tcu::TextureLevel::TextureLevel(&referenceDepthFrame,&depthFormat,iVar5,iVar4,1);
  log = context->m_testCtx->m_log;
  for (iVar5 = 0; iVar5 < renderedColorFrame.m_height; iVar5 = iVar5 + 1) {
    fVar7 = (float)renderedColorFrame.m_height;
    for (iVar4 = 0; iVar2 = renderedColorFrame.m_width, iVar4 < renderedColorFrame.m_width;
        iVar4 = iVar4 + 1) {
      *(undefined4 *)
       ((long)referenceColorFrame.m_pixels.m_ptr +
       (long)(referenceColorFrame.m_width * iVar5 + iVar4) * 4) = 0xff00ff00;
      tcu::TextureLevel::getAccess(&local_a8,&referenceDepthFrame);
      tcu::PixelBufferAccess::setPixDepth
                (&local_a8,((float)iVar4 / (float)iVar2 + (float)iVar5 / fVar7) * 0.5,iVar4,iVar5,0)
      ;
    }
  }
  pRVar1 = context->m_renderCtx;
  tcu::Surface::getAccess(&local_a8,&renderedColorFrame);
  glu::readPixels(pRVar1,0,0,&local_a8);
  qVar6 = QP_TEST_RESULT_FAIL;
  bVar3 = tcu::fuzzyCompare(log,"Result","Color image comparison result",&referenceColorFrame,
                            &renderedColorFrame,0.05,COMPARE_LOG_RESULT);
  if (bVar3) {
    pRVar1 = context->m_renderCtx;
    tcu::TextureLevel::getAccess(&local_a8,&renderedDepthFrame);
    glu::readPixels(pRVar1,0,0,&local_a8);
    bVar3 = ClipControlRenderBaseTest::fuzzyDepthCompare
                      (&this->super_ClipControlRenderBaseTest,log,"Result",
                       "Depth image comparison result",&referenceDepthFrame,&renderedDepthFrame,0.05
                       ,(TextureLevel *)0x0);
    qVar6 = (qpTestResult)!bVar3;
  }
  tcu::TextureLevel::~TextureLevel(&referenceDepthFrame);
  tcu::TextureLevel::~TextureLevel(&renderedDepthFrame);
  tcu::Surface::~Surface(&referenceColorFrame);
  tcu::Surface::~Surface(&renderedColorFrame);
  return qVar6;
}

Assistant:

qpTestResult ValidateFramebuffer(deqp::Context& context)
	{
		const tcu::RenderTarget& renderTarget = context.getRenderContext().getRenderTarget();
		glw::GLuint				 viewportW	= renderTarget.getWidth();
		glw::GLuint				 viewportH	= renderTarget.getHeight();
		tcu::Surface			 renderedColorFrame(viewportW, viewportH);
		tcu::Surface			 referenceColorFrame(viewportW, viewportH);
		tcu::TextureFormat		 depthFormat(tcu::TextureFormat::D, tcu::TextureFormat::FLOAT);
		tcu::TextureLevel		 renderedDepthFrame(depthFormat, viewportW, viewportH);
		tcu::TextureLevel		 referenceDepthFrame(depthFormat, viewportW, viewportH);

		tcu::TestLog& log = context.getTestContext().getLog();

		for (int y = 0; y < renderedColorFrame.getHeight(); y++)
		{
			float yCoord = (float)(y) / (float)renderedColorFrame.getHeight();
			for (int x = 0; x < renderedColorFrame.getWidth(); x++)
			{
				float xCoord = (float)(x) / (float)renderedColorFrame.getWidth();

				referenceColorFrame.setPixel(x, y, tcu::RGBA::green());
				referenceDepthFrame.getAccess().setPixDepth((xCoord + yCoord) * 0.5f, x, y);
			}
		}

		glu::readPixels(context.getRenderContext(), 0, 0, renderedColorFrame.getAccess());
		if (!tcu::fuzzyCompare(log, "Result", "Color image comparison result", referenceColorFrame, renderedColorFrame,
							   0.05f, tcu::COMPARE_LOG_RESULT))
		{

			return QP_TEST_RESULT_FAIL;
		}
		glu::readPixels(context.getRenderContext(), 0, 0, renderedDepthFrame.getAccess());
		if (!fuzzyDepthCompare(log, "Result", "Depth image comparison result", referenceDepthFrame, renderedDepthFrame,
							   0.05f))
		{

			return QP_TEST_RESULT_FAIL;
		}

		return QP_TEST_RESULT_PASS;
	}